

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O3

void modify_vps(Matrix<double> *mat,
               vector<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
               *vps,uint beg_row)

{
  bool bVar1;
  pointer ppVar2;
  vector<double,_std::allocator<double>_> *__x;
  vector<double,_std::allocator<double>_> *this;
  ulong uVar3;
  ulong uVar4;
  Matrix<double> result;
  Matrix<double> local_90;
  
  local_90.m_shape.is_diogonal = (mat->m_shape).is_diogonal;
  local_90.m_shape._9_3_ = *(undefined3 *)&(mat->m_shape).field_0x9;
  local_90.m_shape.n_row = (mat->m_shape).n_row;
  local_90.m_shape.n_col = (mat->m_shape).n_col;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::vector(&local_90.m_elems,&mat->m_elems);
  local_90.m_functions[6] = mat->m_functions[6];
  local_90.m_functions[0] = mat->m_functions[0];
  local_90.m_functions[1] = mat->m_functions[1];
  local_90.m_functions[2] = mat->m_functions[2];
  local_90.m_functions[3] = mat->m_functions[3];
  local_90.m_functions[4] = mat->m_functions[4];
  local_90.m_functions[5] = mat->m_functions[5];
  ppVar2 = (vps->
           super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if ((vps->
      super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
      )._M_impl.super__Vector_impl_data._M_finish != ppVar2) {
    uVar3 = 0;
    uVar4 = 1;
    do {
      __x = Matrix<double>::operator[](mat,ppVar2[uVar3].first);
      this = Matrix<double>::operator[](&local_90,beg_row);
      std::vector<double,_std::allocator<double>_>::operator=(this,__x);
      ppVar2 = (vps->
               super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
               )._M_impl.super__Vector_impl_data._M_start;
      beg_row = beg_row + 1;
      bVar1 = uVar4 < (ulong)((long)(vps->
                                    super__Vector_base<std::pair<unsigned_int,_double>,_std::allocator<std::pair<unsigned_int,_double>_>_>
                                    )._M_impl.super__Vector_impl_data._M_finish - (long)ppVar2 >> 4)
      ;
      uVar3 = uVar4;
      uVar4 = (ulong)((int)uVar4 + 1);
    } while (bVar1);
  }
  (mat->m_shape).is_diogonal = local_90.m_shape.is_diogonal;
  (mat->m_shape).n_row = local_90.m_shape.n_row;
  (mat->m_shape).n_col = local_90.m_shape.n_col;
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::operator=(&mat->m_elems,&local_90.m_elems);
  mat->m_functions[6] = local_90.m_functions[6];
  mat->m_functions[4] = local_90.m_functions[4];
  mat->m_functions[5] = local_90.m_functions[5];
  mat->m_functions[2] = local_90.m_functions[2];
  mat->m_functions[3] = local_90.m_functions[3];
  mat->m_functions[0] = local_90.m_functions[0];
  mat->m_functions[1] = local_90.m_functions[1];
  std::
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ::~vector(&local_90.m_elems);
  return;
}

Assistant:

void modify_vps(Matrix_d& mat, const std::vector<std::pair<unsigned, double>>& vps, unsigned beg_row){
    Matrix_d result=mat;
    for(unsigned i=0;i<vps.size();++i)
        result[beg_row+i]=mat[vps[i].first];
    mat=result;
}